

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Erat.cpp
# Opt level: O0

uint64_t __thiscall primesieve::Erat::getL1CacheSize(Erat *this)

{
  bool bVar1;
  unsigned_long *puVar2;
  CpuInfo *in_RDI;
  uint64_t maxSize;
  uint64_t minSize;
  uint64_t size;
  size_t local_18 [2];
  unsigned_long local_8;
  
  bVar1 = CpuInfo::hasL1Cache(in_RDI);
  if (bVar1) {
    local_18[0] = CpuInfo::l1CacheSize((CpuInfo *)0x160eaf);
    puVar2 = std::min<unsigned_long>(local_18,&in_RDI->threadsPerCore_);
    local_18[0] = *puVar2;
    local_8 = (anonymous_namespace)::inBetween<unsigned_long,unsigned_long,unsigned_long>
                        (0x2000,local_18[0],0x400000);
  }
  else {
    local_8 = in_RDI->threadsPerCore_;
  }
  return local_8;
}

Assistant:

uint64_t Erat::getL1CacheSize() const
{
  if (!cpuInfo.hasL1Cache())
    return sieveSize_;

  uint64_t size = cpuInfo.l1CacheSize();
  uint64_t minSize = 8 << 10;
  uint64_t maxSize = 4096 << 10;

  size = std::min(size, sieveSize_);
  size = inBetween(minSize, size, maxSize);

  return size;
}